

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchcache.hpp
# Opt level: O1

void __thiscall
CorUnix::CSynchCache<CorUnix::CSynchStateController>::~CSynchCache
          (CSynchCache<CorUnix::CSynchStateController> *this)

{
  _USynchCacheStackNode *p_Var1;
  _USynchCacheStackNode *pvMem;
  
  pvMem = (this->m_pHead).m_val;
  (this->m_pHead).m_val = (_USynchCacheStackNode *)0x0;
  (this->m_iDepth).m_val = 0;
  while (pvMem != (_USynchCacheStackNode *)0x0) {
    p_Var1 = pvMem->next;
    InternalFree(pvMem);
    pvMem = p_Var1;
  }
  InternalDeleteCriticalSection(&this->m_cs);
  return;
}

Assistant:

~CSynchCache()
        {        
            Flush(NULL, true);
            InternalDeleteCriticalSection(&m_cs); 
        }